

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::WeakFulfiller<kj::Rc<kj::Refcounted>_>::detach
          (WeakFulfiller<kj::Rc<kj::Refcounted>_> *this,
          PromiseFulfiller<kj::Rc<kj::Refcounted>_> *from)

{
  PromiseFulfiller<kj::Rc<kj::Refcounted>_> *pPVar1;
  PromiseFulfiller<kj::Rc<kj::Refcounted>_> *from_local;
  WeakFulfiller<kj::Rc<kj::Refcounted>_> *this_local;
  
  pPVar1 = WeakFulfillerBase::getInner<kj::Rc<kj::Refcounted>>(&this->super_WeakFulfillerBase);
  if (pPVar1 == (PromiseFulfiller<kj::Rc<kj::Refcounted>_> *)0x0) {
    if (this != (WeakFulfiller<kj::Rc<kj::Refcounted>_> *)0x0) {
      ~WeakFulfiller(this);
      operator_delete(this,0x18);
    }
  }
  else {
    pPVar1 = WeakFulfillerBase::getInner<kj::Rc<kj::Refcounted>>(&this->super_WeakFulfillerBase);
    if (pPVar1 != from) {
      inlineRequireFailure
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
                 ,0x6d8,"getInner<T>() == &from","",(char *)0x0);
    }
    WeakFulfillerBase::setInner<kj::Rc<kj::Refcounted>>
              (&this->super_WeakFulfillerBase,(PromiseFulfiller<kj::Rc<kj::Refcounted>_> *)0x0);
  }
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (getInner<T>() == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(getInner<T>() == &from);
      setInner<T>(nullptr);
    }
  }